

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib654.c
# Opt level: O1

size_t read_callback(char *ptr,size_t size,size_t nmemb,void *userp)

{
  if ((size * nmemb != 0) && (0 < *(long *)((long)userp + 8))) {
    *(long *)((long)userp + 8) = *(long *)((long)userp + 8) + -1;
    *ptr = **userp;
    *(long *)userp = *userp + 1;
    return 1;
  }
  return 0;
}

Assistant:

static size_t read_callback(char *ptr, size_t size, size_t nmemb, void *userp)
{
  struct WriteThis *pooh = (struct WriteThis *)userp;
  int eof = !*pooh->readptr;

  if(size*nmemb < 1)
    return 0;

  eof = pooh->sizeleft <= 0;
  if(!eof)
    pooh->sizeleft--;

  if(!eof) {
    *ptr = *pooh->readptr;           /* copy one single byte */
    pooh->readptr++;                 /* advance pointer */
    return 1;                        /* we return 1 byte at a time! */
  }

  return 0;                         /* no more data left to deliver */
}